

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection,SIMDType simdType)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  byte horizontal_00;
  uint32_t height_00;
  uint32_t in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  undefined1 in_R9B;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  SIMDType in_stack_00000008;
  uint32_t in_stack_0000000c;
  SIMDType in_stack_00000010;
  undefined4 in_stack_00000014;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000020;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *imageStart;
  uint32_t rowSize;
  uint32_t *out;
  uint8_t colorCount;
  uint32_t simdSize;
  uint32_t in_stack_0000010c;
  uint32_t *in_stack_00000110;
  bool in_stack_0000011b;
  uint32_t in_stack_0000011c;
  uint8_t *in_stack_00000120;
  uint32_t in_stack_0000012c;
  uint32_t in_stack_0000025c;
  uint32_t *in_stack_00000260;
  undefined1 in_stack_0000026b;
  uint32_t in_stack_0000026c;
  uint8_t *in_stack_00000270;
  uint32_t in_stack_0000027c;
  uint32_t in_stack_00000510;
  uint32_t in_stack_00000518;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined3 in_stack_ffffffffffffffe4;
  uint width_00;
  
  width_00 = CONCAT13(in_R9B,in_stack_ffffffffffffffe4) & 0x1ffffff;
  height_00 = getSimdSize(in_stack_00000010);
  horizontal_00 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  if ((in_stack_00000010 == cpu_function) || (in_ECX * in_R8D * (uint)horizontal_00 < height_00)) {
    if (in_stack_00000010 == avx_function) {
      ProjectionProfile((Image *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,width_00,height_00,
                        (bool)horizontal_00,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_00000008);
    }
    else {
      Image_Function::ProjectionProfile
                ((Image *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
                 in_stack_00000008,unaff_retaddr_00,unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0),
                 in_stack_00000020);
    }
  }
  else {
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
               (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff90);
    in_ECX = in_ECX * horizontal_00;
    __first._M_current = (uint *)CONCAT44(in_stack_0000000c,in_stack_00000008);
    if ((width_00 & 0x1000000) != 0) {
      in_R8D = in_ECX;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff78);
    __last._M_current._4_4_ = in_R8D;
    __last._M_current._0_4_ = in_stack_ffffffffffffff88;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
              (__first,__last,(uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x137d0c);
    PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    if (in_stack_00000010 == avx_function) {
      avx::ProjectionProfile
                (in_stack_0000027c,in_stack_00000270,in_stack_0000026c,(bool)in_stack_0000026b,
                 in_stack_00000260,in_stack_0000025c,in_ECX - (in_ECX / height_00) * height_00,
                 in_stack_ffffffffffffff88);
    }
    else if (in_stack_00000010 == sse_function) {
      sse::ProjectionProfile
                (in_stack_0000012c,in_stack_00000120,in_stack_0000011c,in_stack_0000011b,
                 in_stack_00000110,in_stack_0000010c,in_stack_00000510,in_stack_00000518);
    }
  }
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );
        const uint8_t colorCount = image.colorCount();

        if( (simdType == cpu_function) || ((width * height * colorCount) < simdSize) ) {
            AVX_CODE( ProjectionProfile( image, x, y, width, height, horizontal, projection, sse_function ); )

            Image_Function::ProjectionProfile( image, x, y, width, height, horizontal, projection );
            return;
        }
        Image_Function::ParameterValidation( image, x, y, width, height );
        width = width * colorCount;

        projection.resize( horizontal ? width : height );
        std::fill( projection.begin(), projection.end(), 0u );
        uint32_t * out = projection.data();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageStart = image.data() + y * rowSize + x * colorCount; 

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
        SSE_CODE( sse::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
        NEON_CODE( neon::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
    }